

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O2

int npf_vsnprintf(char *buffer,size_t bufsz,char *format,__va_list_tag *vlist)

{
  int iVar1;
  code *pc;
  npf_bufputc_ctx_t bufputc_ctx;
  char *local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_38 = 0;
  pc = npf_bufputc_nop;
  if (buffer != (char *)0x0) {
    pc = npf_bufputc;
  }
  local_48 = buffer;
  local_40 = bufsz;
  iVar1 = npf_vpprintf(pc,&local_48,format,vlist);
  (*pc)(0,&local_48);
  if (bufsz != 0 && buffer != (char *)0x0) {
    buffer[bufsz - 1] = '\0';
  }
  return iVar1;
}

Assistant:

int npf_vsnprintf(char *buffer, size_t bufsz, char const *format, va_list vlist) {
  npf_bufputc_ctx_t bufputc_ctx;
  bufputc_ctx.dst = buffer;
  bufputc_ctx.len = bufsz;
  bufputc_ctx.cur = 0;

  npf_putc const pc = buffer ? npf_bufputc : npf_bufputc_nop;
  int const n = npf_vpprintf(pc, &bufputc_ctx, format, vlist);
  pc('\0', &bufputc_ctx);

  if (buffer && bufsz) {
#ifdef NANOPRINTF_SNPRINTF_SAFE_EMPTY_STRING_ON_OVERFLOW
    if (n >= (int)bufsz) { buffer[0] = '\0'; }
#else
    buffer[bufsz - 1] = '\0';
#endif
  }

  return n;
}